

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmidiin.cpp
# Opt level: O0

bool chooseMidiPort(RtMidiIn *rtmidi)

{
  uint uVar1;
  undefined8 uVar2;
  bool bVar3;
  ostream *poVar4;
  allocator<char> local_f9;
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [32];
  uint local_98;
  uint local_94;
  uint nPorts;
  uint i;
  string portName;
  string local_68 [48];
  undefined1 local_38 [8];
  string keyHit;
  RtMidiIn *rtmidi_local;
  
  keyHit.field_2._8_8_ = rtmidi;
  std::operator<<((ostream *)&std::cout,"\nWould you like to open a virtual input port? [y/N] ");
  std::__cxx11::string::string((string *)local_38);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&std::cin,(string *)local_38);
  bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_38,"y");
  uVar2 = keyHit.field_2._8_8_;
  if (bVar3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_68,"RtMidi Input",(allocator<char> *)(portName.field_2._M_local_buf + 0xf));
    (**(code **)(*(long *)uVar2 + 8))(uVar2,local_68);
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator((allocator<char> *)(portName.field_2._M_local_buf + 0xf));
    rtmidi_local._7_1_ = true;
    portName.field_2._8_4_ = 1;
  }
  else {
    std::__cxx11::string::string((string *)&nPorts);
    local_94 = 0;
    local_98 = (**(code **)(*(long *)keyHit.field_2._8_8_ + 0x10))();
    if (local_98 == 0) {
      poVar4 = std::operator<<((ostream *)&std::cout,"No input ports available!");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      rtmidi_local._7_1_ = false;
    }
    else {
      if (local_98 == 1) {
        poVar4 = std::operator<<((ostream *)&std::cout,"\nOpening ");
        (**(code **)(*(long *)keyHit.field_2._8_8_ + 0x18))(local_b8,keyHit.field_2._8_8_,0);
        poVar4 = std::operator<<(poVar4,local_b8);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string(local_b8);
      }
      else {
        for (local_94 = 0; local_94 < local_98; local_94 = local_94 + 1) {
          (**(code **)(*(long *)keyHit.field_2._8_8_ + 0x18))
                    (local_d8,keyHit.field_2._8_8_,local_94);
          std::__cxx11::string::operator=((string *)&nPorts,local_d8);
          std::__cxx11::string::~string(local_d8);
          poVar4 = std::operator<<((ostream *)&std::cout,"  Input port #");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_94);
          poVar4 = std::operator<<(poVar4,": ");
          poVar4 = std::operator<<(poVar4,(string *)&nPorts);
          std::operator<<(poVar4,'\n');
        }
        do {
          std::operator<<((ostream *)&std::cout,"\nChoose a port number: ");
          std::istream::operator>>((istream *)&std::cin,&local_94);
        } while (local_98 <= local_94);
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)&std::cin,(string *)local_38);
      }
      uVar2 = keyHit.field_2._8_8_;
      uVar1 = local_94;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_f8,"RtMidi Input",&local_f9);
      (*(code *)**(undefined8 **)uVar2)(uVar2,uVar1,local_f8);
      std::__cxx11::string::~string(local_f8);
      std::allocator<char>::~allocator(&local_f9);
      rtmidi_local._7_1_ = true;
    }
    portName.field_2._8_4_ = 1;
    std::__cxx11::string::~string((string *)&nPorts);
  }
  std::__cxx11::string::~string((string *)local_38);
  return rtmidi_local._7_1_;
}

Assistant:

bool chooseMidiPort( RtMidiIn *rtmidi )
{
  std::cout << "\nWould you like to open a virtual input port? [y/N] ";

  std::string keyHit;
  std::getline( std::cin, keyHit );
  if ( keyHit == "y" ) {
    rtmidi->openVirtualPort();
    return true;
  }

  std::string portName;
  unsigned int i = 0, nPorts = rtmidi->getPortCount();
  if ( nPorts == 0 ) {
    std::cout << "No input ports available!" << std::endl;
    return false;
  }

  if ( nPorts == 1 ) {
    std::cout << "\nOpening " << rtmidi->getPortName() << std::endl;
  }
  else {
    for ( i=0; i<nPorts; i++ ) {
      portName = rtmidi->getPortName(i);
      std::cout << "  Input port #" << i << ": " << portName << '\n';
    }

    do {
      std::cout << "\nChoose a port number: ";
      std::cin >> i;
    } while ( i >= nPorts );
    std::getline( std::cin, keyHit );  // used to clear out stdin
  }

  rtmidi->openPort( i );

  return true;
}